

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O3

bool __thiscall basisu::basis_compressor::create_ktx2_file(basis_compressor *this)

{
  uint32_t *puVar1;
  undefined1 *puVar2;
  int iVar3;
  basis_texture_type bVar4;
  basisu_backend_slice_desc *pbVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 auVar25 [12];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  vector<unsigned_char> *pvVar28;
  packed_uint<4U> pVar29;
  basis_compressor *pbVar30;
  ulong uVar31;
  size_t sVar32;
  uchar *puVar33;
  uchar *puVar34;
  uchar uVar35;
  undefined8 uVar36;
  char *__function;
  bool bVar37;
  uint8_t min_new_capacity [4];
  ulong uVar38;
  long lVar39;
  uint uVar40;
  key_value *pkVar41;
  undefined1 *puVar42;
  void *pvVar43;
  uint uVar44;
  uint32_t min_new_capacity_00;
  int iVar45;
  uint32_t new_size_2;
  long lVar46;
  uint8_vec *this_00;
  uint32_t new_size_1;
  uint32_t uVar47;
  uint uVar48;
  packed_uint<4U> pVar49;
  ulong uVar50;
  key_value *pkVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  key_value_vec key_values;
  vector<basist::ktx2_level_index> level_index_array;
  uint8_vec key_value_data;
  uint8_vec etc1s_global_data;
  vector<basisu::vector<unsigned_char>_> level_data_bytes;
  vector<basisu::vector<unsigned_char>_> compressed_level_data_bytes;
  uint_vec slice_level_offsets;
  uint32_t new_size;
  uint8_vec dfd;
  char writer_id [128];
  uchar local_1c9;
  vector<basist::ktx2_transcoder::key_value> local_1c8;
  basis_compressor *local_1b0;
  undefined1 local_1a8 [4];
  uchar auStack_1a4 [4];
  uint32_t uStack_1a0;
  uint32_t uStack_19c;
  vector<unsigned_char> local_198;
  vector<unsigned_char> local_188;
  uint local_16c;
  vector<basisu::vector<unsigned_char>_> local_168;
  vector<basisu::vector<unsigned_char>_> local_158;
  elemental_vector local_148;
  uchar *local_130;
  uint32_t local_128;
  uint8_t local_124 [4];
  ulong local_120;
  uint8_vec local_118;
  undefined1 local_108 [20];
  undefined1 auStack_f4 [12];
  undefined1 local_e8 [6];
  uint8_t uStack_e2;
  uint8_t uStack_e1;
  uint32_t uStack_e0;
  packed_uint<4U> pStack_dc;
  undefined1 local_d8 [8];
  uint32_t uStack_d0;
  uint32_t uStack_cc;
  undefined1 local_c8 [16];
  undefined2 local_b8;
  undefined2 uStack_b6;
  uint32_t uStack_b4;
  uint32_t uStack_b0;
  undefined1 uStack_ac;
  undefined1 uStack_ab;
  undefined1 uStack_aa;
  undefined1 uStack_a9;
  undefined4 uStack_a8;
  uchar local_a4 [116];
  
  bVar37 = (this->m_params).m_uastc.m_value;
  if ((bVar37 == true) &&
     (((this->m_params).m_ktx2_uastc_supercompression & ~KTX2_SS_ZSTANDARD) != KTX2_SS_NONE)) {
    return false;
  }
  uVar47 = (this->m_slice_descs).m_size;
  if ((ulong)uVar47 == 0) {
    local_130 = (uchar *)0x0;
    uVar50 = 0;
    auStack_f4._4_4_ = 0;
    auStack_f4._0_4_ = 0;
  }
  else {
    pbVar5 = (this->m_slice_descs).m_p;
    lVar39 = 0;
    auStack_f4._0_4_ = 0;
    auStack_f4._4_4_ = 0;
    uVar50 = 0;
    local_130 = (uchar *)0x0;
    do {
      iVar45 = *(int *)((long)&pbVar5->m_mip_index + lVar39);
      if (iVar45 == 0 && auStack_f4._0_4_ == 0) {
        auStack_f4._0_4_ = *(int *)((long)&pbVar5->m_orig_width + lVar39);
        auStack_f4._4_4_ = *(undefined4 *)((long)&pbVar5->m_orig_height + lVar39);
      }
      iVar3 = *(int *)((long)&pbVar5->m_source_file_index + lVar39);
      uVar44 = iVar3 + 1;
      if ((uint)uVar50 <= uVar44) {
        uVar50 = (ulong)uVar44;
      }
      uVar44 = iVar45 + 1;
      puVar34 = (uchar *)(ulong)uVar44;
      if (uVar44 < (uint)local_130) {
        puVar34 = local_130;
      }
      if (iVar3 == 0) {
        local_130 = puVar34;
      }
      lVar39 = lVar39 + 0x30;
    } while ((ulong)uVar47 * 0x30 != lVar39);
  }
  uVar44 = (uint)uVar50;
  local_16c = 1;
  if ((this->m_params).m_tex_type == cBASISTexTypeCubemapArray) {
    if (0x2aaaaaaa < (uVar44 * -0x55555555 >> 1 | (uint)((uVar44 * -0x55555555 & 1) != 0) << 0x1f))
    {
      __assert_fail("(total_layers % 6) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                    ,0x716,"bool basisu::basis_compressor::create_ktx2_file()");
    }
    if (uVar44 < 6) {
      __assert_fail("total_layers >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                    ,0x719,"bool basisu::basis_compressor::create_ktx2_file()");
    }
    uVar44 = (uint)(uVar50 / 6);
    local_16c = 6;
  }
  local_c8 = (undefined1  [16])0x0;
  _local_d8 = (undefined1  [16])0x0;
  local_108[0] = 0xab;
  local_108[1] = 'K';
  local_108[2] = 'T';
  local_108[3] = 'X';
  local_108[4] = ' ';
  local_108[5] = '2';
  local_108[6] = '0';
  local_108[7] = 0xbb;
  local_108[8] = '\r';
  local_108[9] = '\n';
  local_108[10] = '\x1a';
  local_108[0xb] = '\n';
  auVar52 = packusdw(ZEXT416(local_16c),(undefined1  [16])0x0);
  auVar52 = packusdw(auVar52,auVar52);
  sVar6 = auVar52._0_2_;
  sVar7 = auVar52._2_2_;
  sVar8 = auVar52._4_2_;
  sVar9 = auVar52._6_2_;
  stack0xffffffffffffff1d = SUB1611((undefined1  [16])0x0,5);
  auVar25._1_11_ = stack0xffffffffffffff1d;
  auVar25[0] = (0 < sVar6) * (sVar6 < 0x100) * auVar52[0] - (0xff < sVar6);
  local_e8._0_5_ = auVar25._0_5_ << 0x20;
  local_e8[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar52[2] - (0xff < sVar7);
  uStack_e2 = (0 < sVar8) * (sVar8 < 0x100) * auVar52[4] - (0xff < sVar8);
  uStack_e1 = (0 < sVar9) * (sVar9 < 0x100) * auVar52[6] - (0xff < sVar9);
  local_108[0xc] = '\0';
  local_108[0xd] = '\0';
  local_108[0xe] = '\0';
  local_108[0xf] = '\0';
  auStack_f4._8_4_ = 0;
  local_108._16_4_ = 1;
  min_new_capacity_00 = (uint32_t)local_130;
  uStack_e0 = min_new_capacity_00;
  uVar48 = 0;
  if (1 < uVar44) {
    uVar48 = uVar44;
  }
  unique0x10001699 = local_e8._4_8_;
  local_e8._0_4_ = uVar48;
  pStack_dc.m_bytes = (uint8_t  [4])0x0;
  if ((bVar37 != false) &&
     (((this->m_params).m_ktx2_uastc_supercompression & ~KTX2_SS_ZSTANDARD) != KTX2_SS_NONE)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                  ,0x73c,"bool basisu::basis_compressor::create_ktx2_file()");
  }
  pStack_dc.m_bytes = (uint8_t  [4])0x0;
  local_168.m_p = (vector<unsigned_char> *)0x0;
  local_168.m_size = 0;
  local_168.m_capacity = 0;
  if (min_new_capacity_00 == 0) {
    local_158.m_p = (vector<unsigned_char> *)0x0;
    local_158.m_size = 0;
    local_158.m_capacity = 0;
  }
  else {
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_168,min_new_capacity_00,min_new_capacity_00 == 1,0x10,
               (object_mover)0x0,false);
    if (min_new_capacity_00 != local_168.m_size) {
      memset(local_168.m_p + local_168.m_size,0,(ulong)(min_new_capacity_00 - local_168.m_size) << 4
            );
    }
    local_168.m_size = min_new_capacity_00;
    local_158.m_p = (vector<unsigned_char> *)0x0;
    local_158.m_size = 0;
    local_158.m_capacity = 0;
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_158,min_new_capacity_00,min_new_capacity_00 == 1,0x10,
               (object_mover)0x0,false);
    if (min_new_capacity_00 != local_158.m_size) {
      memset(local_158.m_p + local_158.m_size,0,(ulong)(min_new_capacity_00 - local_158.m_size) << 4
            );
    }
    local_158.m_size = min_new_capacity_00;
    uVar47 = (this->m_slice_descs).m_size;
  }
  local_148.m_p = (void *)0x0;
  local_148.m_size = 0;
  local_148.m_capacity = 0;
  if (uVar47 != 0) {
    elemental_vector::increase_capacity(&local_148,uVar47,uVar47 == 1,4,(object_mover)0x0,false);
    memset((void *)((ulong)local_148.m_size * 4 + (long)local_148.m_p),0,
           (ulong)(uVar47 - local_148.m_size) << 2);
    local_148.m_size = uVar47;
    if ((this->m_slice_descs).m_size != 0) {
      local_1b0 = (basis_compressor *)&(this->m_backend).m_output.m_slice_image_data;
      lVar46 = 10;
      lVar39 = 0;
      uVar50 = 0;
      do {
        pbVar5 = (this->m_slice_descs).m_p;
        uVar48 = (&pbVar5->m_first_block_index)[lVar46];
        if (local_168.m_size <= uVar48) goto LAB_00216f94;
        if (local_148.m_size <= uVar50) goto LAB_00216fcd;
        *(uint32_t *)((long)local_148.m_p + uVar50 * 4) = local_168.m_p[uVar48].m_size;
        uVar48 = (&pbVar5->m_first_block_index)[lVar46];
        if ((this->m_params).m_uastc.m_value == true) {
          if ((local_168.m_size <= uVar48) ||
             (pbVar30 = (basis_compressor *)&(this->m_uastc_backend_output).m_slice_image_data,
             (this->m_uastc_backend_output).m_slice_image_data.m_size <= uVar50)) goto LAB_00216f94;
        }
        else {
          if (local_168.m_size <= uVar48) goto LAB_00216f94;
          pbVar30 = local_1b0;
          if ((this->m_backend).m_output.m_slice_image_data.m_size <= uVar50) goto LAB_0021701b;
        }
        append_vector<basisu::vector<unsigned_char>>
                  (local_168.m_p + uVar48,
                   (vector<unsigned_char> *)(*(long *)&pbVar30->m_params + lVar39));
        uVar50 = uVar50 + 1;
        lVar39 = lVar39 + 0x10;
        lVar46 = lVar46 + 0xc;
      } while (uVar50 < (this->m_slice_descs).m_size);
    }
  }
  if (((this->m_params).m_uastc.m_value == true) && (pStack_dc.m_bytes == (uint8_t  [4])0x2)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                  ,0x764,"bool basisu::basis_compressor::create_ktx2_file()");
  }
  vector<basisu::vector<unsigned_char>_>::operator=(&local_158,&local_168);
  uVar48 = local_16c;
  local_188.m_p = (uchar *)0x0;
  local_188.m_size = 0;
  local_188.m_capacity = 0;
  local_1b0 = this;
  if ((this->m_params).m_uastc.m_value == false) {
    uStack_a8 = 0;
    local_b8 = (undefined2)(this->m_backend).m_output.m_num_endpoints;
    uStack_b6 = (undefined2)(this->m_backend).m_output.m_num_selectors;
    uStack_b4 = (this->m_backend).m_output.m_endpoint_palette.m_size;
    uStack_b0 = (this->m_backend).m_output.m_selector_palette.m_size;
    uStack_ac = (undefined1)(this->m_backend).m_output.m_slice_image_tables.m_size;
    uStack_ab = *(undefined1 *)((long)&(this->m_backend).m_output.m_slice_image_tables.m_size + 1);
    uStack_aa = *(undefined1 *)((long)&(this->m_backend).m_output.m_slice_image_tables.m_size + 2);
    uStack_a9 = *(undefined1 *)((long)&(this->m_backend).m_output.m_slice_image_tables.m_size + 3);
    uVar47 = uVar44 * local_16c * (int)local_130;
    local_1c8.m_p = (key_value *)0x0;
    local_1c8.m_size = 0;
    local_1c8.m_capacity = 0;
    if (uVar47 == 0) {
      sVar32 = 0;
      pkVar41 = (key_value *)0x0;
    }
    else {
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_1c8,uVar47,uVar47 == 1,0x14,
                 vector<basist::ktx2_etc1s_image_desc>::object_mover,false);
      local_1c8.m_size = uVar47;
      sVar32 = (size_t)(uVar47 * 0x14);
      pkVar41 = local_1c8.m_p;
    }
    memset(pkVar41,0,sVar32);
    if ((this->m_slice_descs).m_size != 0) {
      lVar39 = 0x2d;
      lVar46 = 8;
      uVar50 = 0;
      do {
        pbVar5 = (this->m_slice_descs).m_p;
        uVar40 = *(uint *)((long)pbVar5 + lVar39 + -9);
        iVar45 = *(int *)((long)pbVar5 + lVar39 + -5);
        bVar4 = (this->m_params).m_tex_type;
        if (bVar4 != cBASISTexTypeCubemapArray) {
          uVar40 = (uVar40 + iVar45 * uVar44) * uVar48;
          if (*(char *)((long)pbVar5 + lVar39 + -1) != '\0') goto LAB_00215cd3;
          if (bVar4 != cBASISTexTypeVideoFrames) {
LAB_00215d7b:
            if (uVar50 < (this->m_backend).m_output.m_slice_image_data.m_size) {
              if (local_1c8.m_size <= uVar40) goto LAB_00216fe7;
              *(undefined4 *)((long)&(local_1c8.m_p)->m_key + (ulong)uVar40 * 0x14 + 8) =
                   *(undefined4 *)
                    ((long)&((this->m_backend).m_output.m_slice_image_data.m_p)->m_p + lVar46);
              if (uVar50 < local_148.m_size) {
                if (local_1c8.m_size <= uVar40) goto LAB_00216fe7;
                puVar42 = (undefined1 *)((long)&(local_1c8.m_p)->m_key + (ulong)uVar40 * 0x14 + 4);
                goto LAB_00215ddd;
              }
              goto LAB_00216fcd;
            }
            goto LAB_0021701b;
          }
          if (uVar40 < local_1c8.m_size) {
            auVar52 = packusdw(ZEXT416((*(byte *)((long)&pbVar5->m_first_block_index + lVar39) ^ 1)
                                       * 2),(undefined1  [16])0x0);
            auVar52 = packusdw(auVar52,auVar52);
            sVar6 = auVar52._0_2_;
            sVar7 = auVar52._2_2_;
            sVar8 = auVar52._4_2_;
            sVar9 = auVar52._6_2_;
            *(uint *)((long)&(local_1c8.m_p)->m_key + (ulong)uVar40 * 0x14) =
                 CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar52[6] - (0xff < sVar9),
                          CONCAT12((0 < sVar8) * (sVar8 < 0x100) * auVar52[4] - (0xff < sVar8),
                                   CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar52[2] -
                                            (0xff < sVar7),
                                            (0 < sVar6) * (sVar6 < 0x100) * auVar52[0] -
                                            (0xff < sVar6))));
            goto LAB_00215d7b;
          }
LAB_00216fe7:
          __function = 
          "T &basisu::vector<basist::ktx2_etc1s_image_desc>::operator[](size_t) [T = basist::ktx2_etc1s_image_desc]"
          ;
          goto LAB_002170a4;
        }
        uVar40 = uVar40 % 6 + (iVar45 * uVar44 + uVar40 / 6) * uVar48;
        if (*(char *)((long)pbVar5 + lVar39 + -1) != '\x01') goto LAB_00215d7b;
LAB_00215cd3:
        if ((this->m_backend).m_output.m_slice_image_data.m_size <= uVar50) {
LAB_0021701b:
          __assert_fail("i < m_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                        ,0x177,
                        "const T &basisu::vector<basisu::vector<unsigned char>>::operator[](size_t) const [T = basisu::vector<unsigned char>]"
                       );
        }
        if (local_1c8.m_size <= uVar40) goto LAB_00216fe7;
        *(undefined4 *)((long)&(local_1c8.m_p)->m_value + (ulong)uVar40 * 0x14) =
             *(undefined4 *)
              ((long)&((this->m_backend).m_output.m_slice_image_data.m_p)->m_p + lVar46);
        if (local_148.m_size <= uVar50) goto LAB_00216fcd;
        if (local_1c8.m_size <= uVar40) goto LAB_00216fe7;
        puVar42 = (undefined1 *)((long)&(local_1c8.m_p)->m_key + (ulong)uVar40 * 0x14 + 0xc);
LAB_00215ddd:
        puVar2 = (undefined1 *)((long)local_148.m_p + uVar50 * 4);
        uVar22 = puVar2[1];
        uVar23 = puVar2[2];
        uVar24 = puVar2[3];
        *puVar42 = *puVar2;
        puVar42[1] = uVar22;
        puVar42[2] = uVar23;
        puVar42[3] = uVar24;
        uVar50 = uVar50 + 1;
        lVar39 = lVar39 + 0x30;
        lVar46 = lVar46 + 0x10;
      } while (uVar50 < (this->m_slice_descs).m_size);
    }
    uVar47 = local_188.m_size;
    uVar50 = (ulong)local_188.m_size;
    if (uVar50 == 0) {
      uVar50 = 0;
      uVar44 = 0x14;
    }
    else {
      if (&local_b8 < local_188.m_p + uVar50 && local_188.m_p < local_a4) goto LAB_00217070;
      if (0xffffffeb < local_188.m_size) goto LAB_00217051;
      uVar44 = local_188.m_size + 0x14;
    }
    uVar38 = uVar50;
    if (local_188.m_capacity < uVar44) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_188,uVar44,local_188.m_size + 1 == uVar44,1,
                 (object_mover)0x0,false);
      uVar38 = (ulong)local_188.m_size;
    }
    memset(local_188.m_p + uVar38,0,(ulong)(uVar44 - local_188.m_size));
    pbVar30 = local_1b0;
    local_188.m_size = uVar44;
    if (uVar47 < uVar44) {
      *(undefined4 *)(local_188.m_p + uVar50 + 0x10) = uStack_a8;
      *(ulong *)(local_188.m_p + uVar50) = CONCAT44(uStack_b4,CONCAT22(uStack_b6,local_b8));
      *(ulong *)(local_188.m_p + uVar50 + 8) =
           CONCAT17(uStack_a9,CONCAT16(uStack_aa,CONCAT15(uStack_ab,CONCAT14(uStack_ac,uStack_b0))))
      ;
      uVar50 = (ulong)(local_1c8.m_size * 0x14);
      if (local_1c8.m_size * 0x14 == 0) {
LAB_00215f90:
        append_vector<basisu::vector<unsigned_char>>
                  (&local_188,&(pbVar30->m_backend).m_output.m_endpoint_palette);
        append_vector<basisu::vector<unsigned_char>>
                  (&local_188,&(pbVar30->m_backend).m_output.m_selector_palette);
        append_vector<basisu::vector<unsigned_char>>
                  (&local_188,&(pbVar30->m_backend).m_output.m_slice_image_tables);
        pStack_dc.m_bytes = (uint8_t  [4])0x1;
        if (local_1c8.m_p != (key_value *)0x0) {
          free(local_1c8.m_p);
        }
        goto LAB_00215fea;
      }
      pkVar41 = local_1c8.m_p;
      uVar38 = (ulong)uVar44;
      if ((local_188.m_p < (uchar *)((long)&((local_1c8.m_p)->m_key).m_p + uVar50)) &&
         (local_1c8.m_p < (key_value *)(local_188.m_p + uVar38))) {
LAB_00217070:
        __assert_fail("(pObjs + n) <= vec.begin() || (pObjs >= vec.end())",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu.h"
                      ,0xb3,
                      "void basisu::append_vector(T &, const R *, size_t) [T = basisu::vector<unsigned char>, R = unsigned char]"
                     );
      }
      if (uVar50 + uVar38 >> 0x20 != 0) goto LAB_00217051;
      uVar48 = (uint)(uVar50 + uVar38);
      if (uVar44 != uVar48) {
        if (uVar44 <= uVar48) {
          uVar31 = uVar38;
          puVar34 = local_188.m_p;
          uVar40 = uVar44;
          if (local_188.m_capacity < uVar48) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&local_188,uVar48,uVar44 + 1 == uVar48,1,
                       (object_mover)0x0,false);
            uVar31 = (ulong)local_188.m_size;
            puVar34 = local_188.m_p;
            uVar40 = local_188.m_size;
          }
          memset(puVar34 + uVar31,0,(ulong)(uVar48 - uVar40));
        }
        local_188.m_size = uVar48;
        if (uVar44 < uVar48) {
          memcpy(local_188.m_p + uVar38,pkVar41,uVar50);
          goto LAB_00215f90;
        }
      }
    }
LAB_0021703a:
    __function = "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]";
    goto LAB_002170a4;
  }
LAB_00215fea:
  puVar34 = local_130;
  vector<basist::ktx2_transcoder::key_value>::vector
            (&local_1c8,&(local_1b0->m_params).m_ktx2_key_values);
  uVar50 = (ulong)local_1c8.m_size;
  uVar44 = local_1c8.m_size + 1;
  if (uVar44 == 0) {
    pkVar41 = local_1c8.m_p;
    lVar39 = 0;
    do {
      pvVar43 = *(void **)((long)&(pkVar41->m_value).m_p + lVar39);
      if (pvVar43 != (void *)0x0) {
        free(pvVar43);
      }
      pvVar43 = *(void **)((long)&(pkVar41->m_key).m_p + lVar39);
      if (pvVar43 != (void *)0x0) {
        free(pvVar43);
      }
      lVar39 = lVar39 + 0x20;
    } while (lVar39 != 0x1fffffffe0);
    local_1c8.m_size = 0;
    goto LAB_00216fae;
  }
  if (local_1c8.m_capacity < uVar44) {
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_1c8,uVar44,true,0x20,
               vector<basist::ktx2_transcoder::key_value>::object_mover,false);
    if (local_1c8.m_size != uVar44) goto LAB_00216090;
  }
  else {
LAB_00216090:
    memset(local_1c8.m_p + local_1c8.m_size,0,(ulong)(uVar44 - local_1c8.m_size) << 5);
    local_1c8.m_size = uVar44;
  }
  pkVar41 = local_1c8.m_p + uVar50;
  uVar48 = local_1c8.m_p[uVar50].m_key.m_size;
  if (uVar48 != 10) {
    if (uVar48 < 0xb) {
      if ((pkVar41->m_key).m_capacity < 10) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pkVar41,10,uVar48 == 9,1,(object_mover)0x0,false);
        uVar48 = (pkVar41->m_key).m_size;
      }
      memset((pkVar41->m_key).m_p + uVar48,0,(ulong)(10 - uVar48));
    }
    (pkVar41->m_key).m_size = 10;
    uVar44 = local_1c8.m_size;
    if (local_1c8.m_size == 0) goto LAB_00216fae;
  }
  builtin_memcpy(local_1c8.m_p[uVar44 - 1].m_key.m_p,"KTXwriter",10);
  snprintf((char *)&local_b8,0x80,"Basis Universal %s","1.16");
  uVar47 = local_1c8.m_size;
  if (local_1c8.m_size == 0) {
LAB_00216fae:
    __assert_fail("m_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x198,
                  "T &basisu::vector<basist::ktx2_transcoder::key_value>::back() [T = basist::ktx2_transcoder::key_value]"
                 );
  }
  pkVar41 = local_1c8.m_p;
  sVar32 = strlen((char *)&local_b8);
  pbVar30 = local_1b0;
  uVar50 = sVar32 + 1;
  if (uVar50 >> 0x20 != 0) {
LAB_00217051:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x217,
                  "void basisu::vector<unsigned char>::resize(size_t, bool) [T = unsigned char]");
  }
  uVar44 = uVar47 - 1;
  uVar48 = pkVar41[uVar44].m_value.m_size;
  uVar40 = (uint)uVar50;
  if (uVar48 != uVar40) {
    if (uVar48 <= uVar40) {
      if (pkVar41[uVar44].m_value.m_capacity < uVar40) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&pkVar41[uVar44].m_value,uVar40,uVar48 + 1 == uVar40,1,
                   (object_mover)0x0,false);
        uVar48 = pkVar41[uVar44].m_value.m_size;
      }
      memset(pkVar41[uVar44].m_value.m_p + uVar48,0,(ulong)(uVar40 - uVar48));
    }
    pkVar41[uVar44].m_value.m_size = uVar40;
    uVar47 = local_1c8.m_size;
    if (local_1c8.m_size == 0) goto LAB_00216fae;
  }
  memcpy(local_1c8.m_p[uVar47 - 1].m_value.m_p,&local_b8,uVar50);
  uVar50 = (ulong)local_1c8.m_size;
  if (uVar50 != 0) {
    pkVar41 = local_1c8.m_p;
    lVar39 = 0x3f;
    if (uVar50 != 0) {
      for (; local_1c8.m_size >> lVar39 == 0; lVar39 = lVar39 + -1) {
      }
    }
    pkVar51 = local_1c8.m_p + uVar50;
    std::
    __introsort_loop<basist::ktx2_transcoder::key_value*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_1c8.m_p,pkVar51,((uint)lVar39 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<basist::ktx2_transcoder::key_value*,__gnu_cxx::__ops::_Iter_less_iter>
              (pkVar41,pkVar51);
  }
  local_198.m_p = (uchar *)0x0;
  local_198.m_size = 0;
  local_198.m_capacity = 0;
  local_118.m_p = (uchar *)0x0;
  local_118.m_size = 0;
  local_118.m_capacity = 0;
  get_dfd(pbVar30,&local_118,(ktx2_header *)local_108);
  auVar52 = _local_e8;
  local_120 = (ulong)puVar34 & 0xffffffff;
  local_128 = local_118.m_size + (int)puVar34 * 0x18 + 0x50;
  uVar36 = CONCAT71((uint7)local_118.m_size._1_3_,1);
  local_124[0] = pStack_dc.m_bytes[0];
  local_124[1] = pStack_dc.m_bytes[1];
  local_124[2] = pStack_dc.m_bytes[2];
  local_124[3] = pStack_dc.m_bytes[3];
  _local_e8 = auVar52;
  do {
    local_16c = (uint)uVar36;
    if (local_1c8.m_size != 0) {
      uVar44 = 0;
      do {
        uVar48 = local_1c8.m_p[uVar44].m_key.m_size;
        if ((((ulong)uVar48 < 2) || (local_1c8.m_p[uVar44].m_key.m_p[uVar48 - 1] != '\0')) ||
           (uVar50 = (ulong)local_1c8.m_p[uVar44].m_value.m_size + (ulong)uVar48,
           0xfffffffe < uVar50)) {
          bVar37 = false;
          goto LAB_002167a1;
        }
        local_1a8 = (undefined1  [4])(int)uVar50;
        uVar47 = local_198.m_size;
        uVar50 = (ulong)local_198.m_size;
        if (uVar50 == 0) {
          uVar48 = 4;
          uVar50 = 0;
        }
        else {
          if (local_1a8 < local_198.m_p + uVar50 && local_198.m_p < auStack_1a4) goto LAB_00217070;
          if (0xfffffffb < local_198.m_size) goto LAB_00217051;
          uVar48 = local_198.m_size + 4;
        }
        uVar38 = uVar50;
        if (local_198.m_capacity < uVar48) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_198,uVar48,local_198.m_size + 1 == uVar48,1,
                     (object_mover)0x0,false);
          uVar38 = (ulong)local_198.m_size;
        }
        memset(local_198.m_p + uVar38,0,(ulong)(uVar48 - local_198.m_size));
        local_198.m_size = uVar48;
        if (uVar48 <= uVar47) goto LAB_0021703a;
        *(undefined1 (*) [4])(local_198.m_p + uVar50) = local_1a8;
        if (local_1c8.m_size <= uVar44) {
LAB_00217001:
          __function = 
          "T &basisu::vector<basist::ktx2_transcoder::key_value>::operator[](size_t) [T = basist::ktx2_transcoder::key_value]"
          ;
          goto LAB_002170a4;
        }
        append_vector<basisu::vector<unsigned_char>>(&local_198,&local_1c8.m_p[uVar44].m_key);
        if (local_1c8.m_size <= uVar44) goto LAB_00217001;
        append_vector<basisu::vector<unsigned_char>>(&local_198,&local_1c8.m_p[uVar44].m_value);
        puVar34 = local_130;
        uVar40 = local_198.m_size;
        pbVar30 = local_1b0;
        for (uVar48 = -local_198.m_size & 3; local_1b0 = pbVar30, uVar48 != 0; uVar48 = uVar48 - 1)
        {
          uVar50 = (ulong)uVar40;
          local_1c9 = '\0';
          if (((local_198.m_p != (uchar *)0x0) && (local_198.m_p <= &local_1c9)) &&
             (&local_1c9 < local_198.m_p + uVar50)) goto LAB_00216f75;
          if (local_198.m_capacity <= uVar40) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&local_198,uVar40 + 1,true,1,(object_mover)0x0,false);
            uVar50 = (ulong)local_198.m_size;
          }
          local_198.m_p[uVar50] = local_1c9;
          uVar40 = local_198.m_size + 1;
          local_198.m_size = uVar40;
          pbVar30 = local_1b0;
        }
        uVar44 = uVar44 + 1;
      } while (uVar44 < local_1c8.m_size);
    }
    if (local_124 != (uint8_t  [4])0x0) {
LAB_002168cc:
      _local_1a8 = (uchar *)0x0;
      uStack_1a0 = 0;
      uStack_19c = 0;
      uVar47 = (uint32_t)puVar34;
      if (uVar47 == 0) {
        sVar32 = 0;
        pvVar43 = (void *)0x0;
      }
      else {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_1a8,uVar47,uVar47 == 1,0x18,
                   vector<basist::ktx2_level_index>::object_mover,false);
        uStack_1a0 = uVar47;
        sVar32 = (size_t)(uVar47 * 0x18);
        pvVar43 = _local_1a8;
      }
      memset(pvVar43,0,sVar32);
      this_00 = &pbVar30->m_output_ktx2_file;
      puVar34 = (pbVar30->m_output_ktx2_file).m_p;
      if (puVar34 != (uchar *)0x0) {
        free(puVar34);
        this_00->m_p = (uchar *)0x0;
        this_00->m_size = 0;
        this_00->m_capacity = 0;
      }
      pbVar30 = local_1b0;
      vector<unsigned_char>::reserve(this_00,(ulong)(local_1b0->m_output_basis_file).m_size);
      uVar44 = (pbVar30->m_output_ktx2_file).m_size;
      if (uVar44 != 0x50) {
        if (uVar44 < 0x51) {
          if ((local_1b0->m_output_ktx2_file).m_capacity < 0x50) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)this_00,0x50,uVar44 == 0x4f,1,(object_mover)0x0,false);
            uVar44 = (local_1b0->m_output_ktx2_file).m_size;
          }
          memset(this_00->m_p + uVar44,0,(ulong)(0x50 - uVar44));
        }
        (local_1b0->m_output_ktx2_file).m_size = 0x50;
      }
      uVar44 = uStack_1a0 * 0x18;
      if (uVar44 == 0) {
        pVar49.m_bytes[0] = 'P';
        pVar49.m_bytes[1] = '\0';
        pVar49.m_bytes[2] = '\0';
        pVar49.m_bytes[3] = '\0';
      }
      else {
        puVar34 = _local_1a8;
        if (_local_1a8 < this_00->m_p + 0x50 && this_00->m_p < _local_1a8 + uVar44)
        goto LAB_00217070;
        if (0xffffffaf < uVar44) goto LAB_00217051;
        uVar48 = uVar44 + 0x50;
        if ((local_1b0->m_output_ktx2_file).m_capacity < uVar48) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)this_00,uVar48,false,1,(object_mover)0x0,false);
          uVar40 = (local_1b0->m_output_ktx2_file).m_size;
          uVar50 = (ulong)uVar40;
        }
        else {
          uVar40 = 0x50;
          uVar50 = 0x50;
        }
        pbVar30 = local_1b0;
        memset((local_1b0->m_output_ktx2_file).m_p + uVar50,0,(ulong)(uVar48 - uVar40));
        (pbVar30->m_output_ktx2_file).m_size = uVar48;
        memcpy((pbVar30->m_output_ktx2_file).m_p + 0x50,puVar34,(ulong)uVar44);
        pVar49.m_bytes = (uint8_t  [4])(pbVar30->m_output_ktx2_file).m_size;
      }
      uVar50 = (ulong)local_118.m_size;
      local_d8._4_4_ = local_118.m_size;
      local_d8[0] = pVar49.m_bytes[0];
      local_d8[1] = pVar49.m_bytes[1];
      local_d8[2] = pVar49.m_bytes[2];
      local_d8[3] = pVar49.m_bytes[3];
      if (uVar50 != 0) {
        uVar38 = (ulong)(uint)pVar49.m_bytes;
        if (((pVar49.m_bytes != (uint8_t  [4])0x0) && (this_00->m_p < local_118.m_p + uVar50)) &&
           (local_118.m_p < this_00->m_p + uVar38)) goto LAB_00217070;
        if (uVar50 + uVar38 >> 0x20 != 0) goto LAB_00217051;
        min_new_capacity = SUB84(uVar50 + uVar38,0);
        if (pVar49.m_bytes == min_new_capacity) goto LAB_0021703a;
        puVar34 = local_118.m_p;
        if ((uint)pVar49.m_bytes <= (uint)min_new_capacity) {
          local_130 = local_118.m_p;
          uVar31 = uVar38;
          pVar29.m_bytes = pVar49.m_bytes;
          if ((local_1b0->m_output_ktx2_file).m_capacity < (uint)min_new_capacity) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)this_00,(uint32_t)min_new_capacity,
                       pVar49.m_bytes + 1U == min_new_capacity,1,(object_mover)0x0,false);
            pVar29.m_bytes = (uint8_t  [4])(local_1b0->m_output_ktx2_file).m_size;
            uVar31 = (ulong)(uint)pVar29.m_bytes;
          }
          memset(this_00->m_p + uVar31,0,(ulong)(uint)((int)min_new_capacity - (int)pVar29.m_bytes))
          ;
          puVar34 = local_130;
        }
        (local_1b0->m_output_ktx2_file).m_size = (uint32_t)min_new_capacity;
        if ((uint)min_new_capacity <= (uint)pVar49.m_bytes) goto LAB_0021703a;
        memcpy(this_00->m_p + uVar38,puVar34,uVar50);
      }
      if (local_198.m_size != 0) {
        if (local_128 != (local_1b0->m_output_ktx2_file).m_size) {
          __assert_fail("kvd_file_offset == m_output_ktx2_file.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                        ,0x822,"bool basisu::basis_compressor::create_ktx2_file()");
        }
        uStack_d0 = local_128;
        uStack_cc = local_198.m_size;
        append_vector<basisu::vector<unsigned_char>>(this_00,&local_198);
      }
      if (local_188.m_size == 0) goto LAB_00216cd9;
      uVar44 = (local_1b0->m_output_ktx2_file).m_size;
      uVar48 = -uVar44 & 7;
      if (uVar48 == 0) goto LAB_00216c54;
      goto LAB_00216bc6;
    }
    uVar44 = -(local_198.m_size + local_128) & 0xf;
    if (uVar44 == 0) goto LAB_002168cc;
    if ((local_16c & 1) == 0) {
      __assert_fail("!pass",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                    ,0x7f1,"bool basisu::basis_compressor::create_ktx2_file()");
    }
    uVar48 = uVar44 + 0x10;
    if (5 < uVar44) {
      uVar48 = uVar44;
    }
    printf(
          "WARNING: Due to a KTX2 validator bug related to mipPadding, we must insert a dummy key into the KTX2 file of %u bytes\n"
          );
    uVar44 = local_1c8.m_size + 1;
    if (uVar44 == 0) {
      pkVar41 = local_1c8.m_p;
      lVar39 = 0;
      do {
        pvVar43 = *(void **)((long)&(pkVar41->m_value).m_p + lVar39);
        if (pvVar43 != (void *)0x0) {
          free(pvVar43);
        }
        pvVar43 = *(void **)((long)&(pkVar41->m_key).m_p + lVar39);
        if (pvVar43 != (void *)0x0) {
          free(pvVar43);
        }
        lVar39 = lVar39 + 0x20;
      } while (lVar39 != 0x1fffffffe0);
    }
    else {
      if (local_1c8.m_capacity < uVar44) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_1c8,uVar44,true,0x20,
                   vector<basist::ktx2_transcoder::key_value>::object_mover,false);
        if (local_1c8.m_size == uVar44) goto LAB_0021658d;
      }
      memset(local_1c8.m_p + local_1c8.m_size,0,(ulong)(uVar44 - local_1c8.m_size) << 5);
    }
LAB_0021658d:
    local_1c8.m_size = uVar44;
    iVar45 = uVar48 - 6;
    pbVar30 = local_1b0;
    while( true ) {
      local_1b0 = pbVar30;
      if (iVar45 == 0) break;
      if (uVar44 == 0) goto LAB_00216fae;
      uVar44 = uVar44 - 1;
      local_1a8[0] = 0x7f;
      puVar33 = local_1c8.m_p[uVar44].m_key.m_p;
      uVar48 = local_1c8.m_p[uVar44].m_key.m_size;
      uVar50 = (ulong)uVar48;
      if (local_1a8 < puVar33 + uVar50 && (puVar33 <= local_1a8 && puVar33 != (uchar *)0x0))
      goto LAB_00216f75;
      pkVar41 = local_1c8.m_p + uVar44;
      uVar35 = '\x7f';
      if ((pkVar41->m_key).m_capacity <= uVar48) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pkVar41,uVar48 + 1,true,1,(object_mover)0x0,false);
        puVar33 = (pkVar41->m_key).m_p;
        uVar50 = (ulong)(pkVar41->m_key).m_size;
        uVar35 = local_1a8[0];
      }
      puVar33[uVar50] = uVar35;
      puVar1 = &(pkVar41->m_key).m_size;
      *puVar1 = *puVar1 + 1;
      iVar45 = iVar45 + -1;
      uVar44 = local_1c8.m_size;
      pbVar30 = local_1b0;
    }
    if (uVar44 == 0) goto LAB_00216fae;
    uVar44 = uVar44 - 1;
    auVar26[0xf] = 0;
    auVar26._0_15_ = stack0xfffffffffffffe59;
    _local_1a8 = (elemental_vector)(auVar26 << 8);
    puVar33 = local_1c8.m_p[uVar44].m_key.m_p;
    uVar48 = local_1c8.m_p[uVar44].m_key.m_size;
    uVar50 = (ulong)uVar48;
    if (local_1a8 < puVar33 + uVar50 && (puVar33 <= local_1a8 && puVar33 != (uchar *)0x0))
    goto LAB_00216f75;
    pkVar41 = local_1c8.m_p + uVar44;
    if (uVar48 < (pkVar41->m_key).m_capacity) {
      uVar35 = '\0';
    }
    else {
      elemental_vector::increase_capacity
                ((elemental_vector *)pkVar41,uVar48 + 1,true,1,(object_mover)0x0,false);
      puVar33 = (pkVar41->m_key).m_p;
      uVar50 = (ulong)(pkVar41->m_key).m_size;
      uVar35 = local_1a8[0];
    }
    puVar33[uVar50] = uVar35;
    puVar1 = &(pkVar41->m_key).m_size;
    *puVar1 = *puVar1 + 1;
    if (local_1c8.m_size == 0) goto LAB_00216fae;
    pkVar41 = local_1c8.m_p;
    uVar48 = local_1c8.m_size - 1;
    auVar27[0xf] = 0;
    auVar27._0_15_ = stack0xfffffffffffffe59;
    _local_1a8 = (elemental_vector)(auVar27 << 8);
    puVar33 = local_1c8.m_p[uVar48].m_value.m_p;
    uVar44 = local_1c8.m_p[uVar48].m_value.m_size;
    uVar50 = (ulong)uVar44;
    if (local_1a8 < puVar33 + uVar50 && (puVar33 <= local_1a8 && puVar33 != (uchar *)0x0))
    goto LAB_00216f75;
    pkVar51 = local_1c8.m_p + uVar48;
    if (uVar44 < local_1c8.m_p[uVar48].m_value.m_capacity) {
      uVar35 = '\0';
    }
    else {
      elemental_vector::increase_capacity
                ((elemental_vector *)&pkVar51->m_value,uVar44 + 1,true,1,(object_mover)0x0,false);
      puVar33 = (pkVar51->m_value).m_p;
      uVar50 = (ulong)pkVar41[uVar48].m_value.m_size;
      uVar35 = local_1a8[0];
    }
    puVar33[uVar50] = uVar35;
    puVar1 = &pkVar41[uVar48].m_value.m_size;
    *puVar1 = *puVar1 + 1;
    uVar50 = (ulong)local_1c8.m_size;
    if (uVar50 != 0) {
      lVar39 = 0x3f;
      if (uVar50 != 0) {
        for (; local_1c8.m_size >> lVar39 == 0; lVar39 = lVar39 + -1) {
        }
      }
      std::
      __introsort_loop<basist::ktx2_transcoder::key_value*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_1c8.m_p,local_1c8.m_p + uVar50,((uint)lVar39 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<basist::ktx2_transcoder::key_value*,__gnu_cxx::__ops::_Iter_less_iter>
                ();
    }
    uVar36 = 0;
    if (local_198.m_size != 0) {
      local_198.m_size = 0;
      uVar36 = 0;
    }
  } while( true );
LAB_00216fcd:
  __function = "T &basisu::vector<unsigned int>::operator[](size_t) [T = unsigned int]";
  goto LAB_002170a4;
  while( true ) {
    if ((local_1b0->m_output_ktx2_file).m_capacity <= uVar44) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this_00,uVar44 + 1,true,1,(object_mover)0x0,false);
      puVar34 = (local_1b0->m_output_ktx2_file).m_p;
      uVar50 = (ulong)(local_1b0->m_output_ktx2_file).m_size;
    }
    puVar34[uVar50] = local_1c9;
    uVar44 = (local_1b0->m_output_ktx2_file).m_size + 1;
    (local_1b0->m_output_ktx2_file).m_size = uVar44;
    uVar48 = uVar48 - 1;
    if (uVar48 == 0) break;
LAB_00216bc6:
    local_1c9 = '\0';
    puVar34 = this_00->m_p;
    uVar50 = (ulong)uVar44;
    if (((puVar34 != (uchar *)0x0) && (puVar34 <= &local_1c9)) && (&local_1c9 < puVar34 + uVar50))
    goto LAB_00216f75;
  }
LAB_00216c54:
  auVar52._4_4_ = 0;
  auVar52._0_4_ = local_188.m_size;
  auVar52._8_4_ = local_188.m_size;
  auVar52._12_4_ = 0;
  auVar55._4_4_ = 0;
  auVar55._0_4_ = local_188.m_size >> 8;
  auVar55._8_4_ = local_188.m_size >> 8;
  auVar55._12_4_ = 0;
  auVar55 = pblendw(auVar55,ZEXT416(local_188.m_size),0xf);
  auVar52 = pshufb(auVar52,_DAT_00318430);
  auVar59 = pmovzxbq(in_XMM3,0xffff);
  auVar52 = packusdw(auVar55 & auVar59,auVar52);
  auVar52 = packusdw(auVar52,(undefined1  [16])0x0);
  auVar60._4_4_ = 0;
  auVar60._0_4_ = uVar44;
  auVar60._8_4_ = uVar44;
  auVar60._12_4_ = 0;
  auVar61._4_4_ = 0;
  auVar61._0_4_ = uVar44 >> 8;
  auVar61._8_4_ = uVar44 >> 8;
  auVar61._12_4_ = 0;
  auVar61 = pblendw(auVar61,ZEXT416(uVar44),0xf);
  auVar55 = pshufb(auVar60,_DAT_00318430);
  auVar55 = packusdw(auVar61 & auVar59,auVar55);
  auVar55 = packusdw(auVar55,(undefined1  [16])0x0);
  sVar6 = auVar55._0_2_;
  sVar7 = auVar55._2_2_;
  sVar8 = auVar55._4_2_;
  sVar9 = auVar55._6_2_;
  sVar10 = auVar55._8_2_;
  sVar11 = auVar55._10_2_;
  sVar12 = auVar55._12_2_;
  sVar13 = auVar55._14_2_;
  sVar14 = auVar52._0_2_;
  sVar15 = auVar52._2_2_;
  sVar16 = auVar52._4_2_;
  sVar17 = auVar52._6_2_;
  sVar18 = auVar52._8_2_;
  sVar19 = auVar52._10_2_;
  sVar20 = auVar52._12_2_;
  sVar21 = auVar52._14_2_;
  local_c8[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar55[2] - (0xff < sVar7);
  local_c8[0] = (0 < sVar6) * (sVar6 < 0x100) * auVar55[0] - (0xff < sVar6);
  local_c8[2] = (0 < sVar8) * (sVar8 < 0x100) * auVar55[4] - (0xff < sVar8);
  local_c8[3] = (0 < sVar9) * (sVar9 < 0x100) * auVar55[6] - (0xff < sVar9);
  local_c8[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar55[8] - (0xff < sVar10);
  local_c8[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar55[10] - (0xff < sVar11);
  local_c8[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar55[0xc] - (0xff < sVar12);
  local_c8[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar55[0xe] - (0xff < sVar13);
  local_c8[8] = (0 < sVar14) * (sVar14 < 0x100) * auVar52[0] - (0xff < sVar14);
  local_c8[9] = (0 < sVar15) * (sVar15 < 0x100) * auVar52[2] - (0xff < sVar15);
  local_c8[10] = (0 < sVar16) * (sVar16 < 0x100) * auVar52[4] - (0xff < sVar16);
  local_c8[0xb] = (0 < sVar17) * (sVar17 < 0x100) * auVar52[6] - (0xff < sVar17);
  local_c8[0xc] = (0 < sVar18) * (sVar18 < 0x100) * auVar52[8] - (0xff < sVar18);
  local_c8[0xd] = (0 < sVar19) * (sVar19 < 0x100) * auVar52[10] - (0xff < sVar19);
  local_c8[0xe] = (0 < sVar20) * (sVar20 < 0x100) * auVar52[0xc] - (0xff < sVar20);
  local_c8[0xf] = (0 < sVar21) * (sVar21 < 0x100) * auVar52[0xe] - (0xff < sVar21);
  append_vector<basisu::vector<unsigned_char>>(this_00,&local_188);
LAB_00216cd9:
  pbVar30 = local_1b0;
  uVar50 = local_120;
  if ((local_124 == (uint8_t  [4])0x0) &&
     (uVar44 = -(local_1b0->m_output_ktx2_file).m_size & 0xf, uVar44 != 0)) {
    printf("Warning: KTX2 mip level data is not 16-byte aligned. This may trigger a ktx2check validation bug. Writing %u bytes of mipPadding.\n"
           ,(ulong)uVar44);
    uVar48 = (pbVar30->m_output_ktx2_file).m_size;
    do {
      local_1c9 = '\0';
      puVar34 = this_00->m_p;
      uVar50 = (ulong)uVar48;
      if (((puVar34 != (uchar *)0x0) && (puVar34 <= &local_1c9)) && (&local_1c9 < puVar34 + uVar50))
      {
LAB_00216f75:
        __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x267,
                      "void basisu::vector<unsigned char>::push_back(const T &) [T = unsigned char]"
                     );
      }
      if ((local_1b0->m_output_ktx2_file).m_capacity <= uVar48) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,uVar48 + 1,true,1,(object_mover)0x0,false);
        puVar34 = (local_1b0->m_output_ktx2_file).m_p;
        uVar50 = (ulong)(local_1b0->m_output_ktx2_file).m_size;
      }
      puVar34[uVar50] = local_1c9;
      uVar48 = (local_1b0->m_output_ktx2_file).m_size + 1;
      (local_1b0->m_output_ktx2_file).m_size = uVar48;
      uVar44 = uVar44 - 1;
      uVar50 = local_120;
    } while (uVar44 != 0);
  }
  do {
    pbVar30 = local_1b0;
    uVar44 = (uint)(uVar50 - 1);
    if ((int)uVar44 < 0) {
      memcpy((local_1b0->m_output_ktx2_file).m_p,local_108,0x50);
      memcpy((pbVar30->m_output_ktx2_file).m_p + 0x50,_local_1a8,(ulong)(uStack_1a0 * 0x18));
      debug_printf("Total .ktx2 output file size: %u\n",(ulong)(pbVar30->m_output_ktx2_file).m_size)
      ;
      if (_local_1a8 != (uchar *)0x0) {
        free(_local_1a8);
      }
      bVar37 = true;
LAB_002167a1:
      if (local_118.m_p != (uchar *)0x0) {
        free(local_118.m_p);
      }
      if (local_198.m_p != (uchar *)0x0) {
        free(local_198.m_p);
      }
      pkVar41 = local_1c8.m_p;
      if (local_1c8.m_p != (key_value *)0x0) {
        uVar50 = (ulong)local_1c8.m_size;
        if (uVar50 != 0) {
          lVar39 = 0;
          do {
            pvVar43 = *(void **)((long)&(pkVar41->m_value).m_p + lVar39);
            if (pvVar43 != (void *)0x0) {
              free(pvVar43);
            }
            pvVar43 = *(void **)((long)&(pkVar41->m_key).m_p + lVar39);
            if (pvVar43 != (void *)0x0) {
              free(pvVar43);
            }
            lVar39 = lVar39 + 0x20;
          } while (uVar50 << 5 != lVar39);
        }
        free(local_1c8.m_p);
      }
      if (local_188.m_p != (uchar *)0x0) {
        free(local_188.m_p);
      }
      if (local_148.m_p != (void *)0x0) {
        free(local_148.m_p);
      }
      pvVar28 = local_158.m_p;
      if (local_158.m_p != (vector<unsigned_char> *)0x0) {
        uVar50 = (ulong)local_158.m_size;
        if (uVar50 != 0) {
          lVar39 = 0;
          do {
            pvVar43 = *(void **)((long)&pvVar28->m_p + lVar39);
            if (pvVar43 != (void *)0x0) {
              free(pvVar43);
            }
            lVar39 = lVar39 + 0x10;
          } while (uVar50 << 4 != lVar39);
        }
        free(local_158.m_p);
      }
      pvVar28 = local_168.m_p;
      if (local_168.m_p != (vector<unsigned_char> *)0x0) {
        uVar50 = (ulong)local_168.m_size;
        if (uVar50 != 0) {
          lVar39 = 0;
          do {
            pvVar43 = *(void **)((long)&pvVar28->m_p + lVar39);
            if (pvVar43 != (void *)0x0) {
              free(pvVar43);
            }
            lVar39 = lVar39 + 0x10;
          } while (uVar50 << 4 != lVar39);
        }
        free(local_168.m_p);
      }
      return bVar37;
    }
    if (local_158.m_size <= uVar44) break;
    if (uStack_1a0 <= uVar44) {
LAB_0021708f:
      __function = 
      "T &basisu::vector<basist::ktx2_level_index>::operator[](size_t) [T = basist::ktx2_level_index]"
      ;
      goto LAB_002170a4;
    }
    uVar38 = (ulong)(uVar44 & 0x7fffffff);
    uVar48 = local_158.m_p[uVar38].m_size;
    auVar59._4_4_ = 0;
    auVar59._0_4_ = uVar48;
    auVar59._8_4_ = uVar48;
    auVar59._12_4_ = 0;
    auVar56._4_4_ = 0;
    auVar56._0_4_ = uVar48 >> 8;
    auVar56._8_4_ = uVar48 >> 8;
    auVar56._12_4_ = 0;
    auVar55 = pblendw(auVar56,ZEXT416(uVar48),0xf);
    auVar52 = pshufb(auVar59,_DAT_00318430);
    auVar52 = packusdw(auVar55 & _DAT_00318440,auVar52);
    auVar52 = packusdw(auVar52,(undefined1  [16])0x0);
    sVar6 = auVar52._0_2_;
    sVar7 = auVar52._2_2_;
    sVar8 = auVar52._4_2_;
    sVar9 = auVar52._6_2_;
    sVar10 = auVar52._8_2_;
    sVar11 = auVar52._10_2_;
    sVar12 = auVar52._12_2_;
    sVar13 = auVar52._14_2_;
    *(ulong *)((long)_local_1a8 + uVar38 * 0x18 + 8) =
         CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar52[0xe] - (0xff < sVar13),
                  CONCAT16((0 < sVar12) * (sVar12 < 0x100) * auVar52[0xc] - (0xff < sVar12),
                           CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar52[10] - (0xff < sVar11),
                                    CONCAT14((0 < sVar10) * (sVar10 < 0x100) * auVar52[8] -
                                             (0xff < sVar10),
                                             CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar52[6] -
                                                      (0xff < sVar9),
                                                      CONCAT12((0 < sVar8) * (sVar8 < 0x100) *
                                                               auVar52[4] - (0xff < sVar8),
                                                               CONCAT11((0 < sVar7) *
                                                                        (sVar7 < 0x100) * auVar52[2]
                                                                        - (0xff < sVar7),
                                                                        (0 < sVar6) *
                                                                        (sVar6 < 0x100) * auVar52[0]
                                                                        - (0xff < sVar6))))))));
    if ((local_1b0->m_params).m_uastc.m_value == true) {
      if (local_168.m_size <= uVar44) break;
      if (uStack_1a0 <= uVar44) goto LAB_0021708f;
      uVar48 = local_168.m_p[uVar38].m_size;
      auVar53._4_4_ = 0;
      auVar53._0_4_ = uVar48;
      auVar53._8_4_ = uVar48;
      auVar53._12_4_ = 0;
      auVar57._4_4_ = 0;
      auVar57._0_4_ = uVar48 >> 8;
      auVar57._8_4_ = uVar48 >> 8;
      auVar57._12_4_ = 0;
      auVar55 = pblendw(auVar57,ZEXT416(uVar48),0xf);
      auVar52 = pshufb(auVar53,_DAT_00318430);
      auVar52 = packusdw(auVar55 & _DAT_00318440,auVar52);
      auVar52 = packusdw(auVar52,(undefined1  [16])0x0);
      sVar6 = auVar52._0_2_;
      sVar7 = auVar52._2_2_;
      sVar8 = auVar52._4_2_;
      sVar9 = auVar52._6_2_;
      sVar10 = auVar52._8_2_;
      sVar11 = auVar52._10_2_;
      sVar12 = auVar52._12_2_;
      sVar13 = auVar52._14_2_;
      *(ulong *)((long)_local_1a8 + uVar38 * 0x18 + 0x10) =
           CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar52[0xe] - (0xff < sVar13),
                    CONCAT16((0 < sVar12) * (sVar12 < 0x100) * auVar52[0xc] - (0xff < sVar12),
                             CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar52[10] -
                                      (0xff < sVar11),
                                      CONCAT14((0 < sVar10) * (sVar10 < 0x100) * auVar52[8] -
                                               (0xff < sVar10),
                                               CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar52[6] -
                                                        (0xff < sVar9),
                                                        CONCAT12((0 < sVar8) * (sVar8 < 0x100) *
                                                                 auVar52[4] - (0xff < sVar8),
                                                                 CONCAT11((0 < sVar7) *
                                                                          (sVar7 < 0x100) *
                                                                          auVar52[2] -
                                                                          (0xff < sVar7),
                                                                          (0 < sVar6) *
                                                                          (sVar6 < 0x100) *
                                                                          auVar52[0] -
                                                                          (0xff < sVar6))))))));
    }
    if (uStack_1a0 <= uVar44) goto LAB_0021708f;
    uVar48 = (local_1b0->m_output_ktx2_file).m_size;
    auVar54._4_4_ = 0;
    auVar54._0_4_ = uVar48;
    auVar54._8_4_ = uVar48;
    auVar54._12_4_ = 0;
    auVar58._4_4_ = 0;
    auVar58._0_4_ = uVar48 >> 8;
    auVar58._8_4_ = uVar48 >> 8;
    auVar58._12_4_ = 0;
    auVar55 = pblendw(auVar58,ZEXT416(uVar48),0xf);
    auVar52 = pshufb(auVar54,_DAT_00318430);
    auVar52 = packusdw(auVar55 & _DAT_00318440,auVar52);
    auVar52 = packusdw(auVar52,(undefined1  [16])0x0);
    sVar6 = auVar52._0_2_;
    sVar7 = auVar52._2_2_;
    sVar8 = auVar52._4_2_;
    sVar9 = auVar52._6_2_;
    sVar10 = auVar52._8_2_;
    sVar11 = auVar52._10_2_;
    sVar12 = auVar52._12_2_;
    sVar13 = auVar52._14_2_;
    *(ulong *)((long)_local_1a8 + uVar38 * 0x18) =
         CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar52[0xe] - (0xff < sVar13),
                  CONCAT16((0 < sVar12) * (sVar12 < 0x100) * auVar52[0xc] - (0xff < sVar12),
                           CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar52[10] - (0xff < sVar11),
                                    CONCAT14((0 < sVar10) * (sVar10 < 0x100) * auVar52[8] -
                                             (0xff < sVar10),
                                             CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar52[6] -
                                                      (0xff < sVar9),
                                                      CONCAT12((0 < sVar8) * (sVar8 < 0x100) *
                                                               auVar52[4] - (0xff < sVar8),
                                                               CONCAT11((0 < sVar7) *
                                                                        (sVar7 < 0x100) * auVar52[2]
                                                                        - (0xff < sVar7),
                                                                        (0 < sVar6) *
                                                                        (sVar6 < 0x100) * auVar52[0]
                                                                        - (0xff < sVar6))))))));
    if (local_158.m_size <= uVar44) break;
    append_vector<basisu::vector<unsigned_char>>(this_00,local_158.m_p + uVar38);
    uVar50 = uVar50 - 1;
  } while( true );
LAB_00216f94:
  __function = 
  "T &basisu::vector<basisu::vector<unsigned char>>::operator[](size_t) [T = basisu::vector<unsigned char>]"
  ;
LAB_002170a4:
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x178,__function);
}

Assistant:

bool basis_compressor::create_ktx2_file()
	{
		if (m_params.m_uastc)
		{
			if ((m_params.m_ktx2_uastc_supercompression != basist::KTX2_SS_NONE) && (m_params.m_ktx2_uastc_supercompression != basist::KTX2_SS_ZSTANDARD))
				return false;
		}

		const basisu_backend_output& backend_output = m_backend.get_output();

		// Determine the width/height, number of array layers, mipmap levels, and the number of faces (1 for 2D, 6 for cubemap).
		// This does not support 1D or 3D.
		uint32_t base_width = 0, base_height = 0, total_layers = 0, total_levels = 0, total_faces = 1;
				
		for (uint32_t i = 0; i < m_slice_descs.size(); i++)
		{
			if ((m_slice_descs[i].m_mip_index == 0) && (!base_width))
			{
				base_width = m_slice_descs[i].m_orig_width;
				base_height = m_slice_descs[i].m_orig_height;
			}

			total_layers = maximum<uint32_t>(total_layers, m_slice_descs[i].m_source_file_index + 1);

			if (!m_slice_descs[i].m_source_file_index)
				total_levels = maximum<uint32_t>(total_levels, m_slice_descs[i].m_mip_index + 1);
		}

		if (m_params.m_tex_type == basist::cBASISTexTypeCubemapArray)
		{
			assert((total_layers % 6) == 0);
			
			total_layers /= 6;
			assert(total_layers >= 1);

			total_faces = 6;
		}

		basist::ktx2_header header = {};
		memset((void*)&header, 0, sizeof(header));

		memcpy(header.m_identifier, basist::g_ktx2_file_identifier, sizeof(basist::g_ktx2_file_identifier));
		header.m_pixel_width = base_width;
		header.m_pixel_height = base_height;
		header.m_face_count = total_faces;
		header.m_vk_format = basist::KTX2_VK_FORMAT_UNDEFINED;
		header.m_type_size = 1;
		header.m_level_count = total_levels;
		header.m_layer_count = (total_layers > 1) ? total_layers : 0;

		if (m_params.m_uastc)
		{
			switch (m_params.m_ktx2_uastc_supercompression)
			{
			case basist::KTX2_SS_NONE:
			{
				header.m_supercompression_scheme = basist::KTX2_SS_NONE;
				break;
			}
			case basist::KTX2_SS_ZSTANDARD:
			{
#if BASISD_SUPPORT_KTX2_ZSTD
				header.m_supercompression_scheme = basist::KTX2_SS_ZSTANDARD;
#else
				header.m_supercompression_scheme = basist::KTX2_SS_NONE;
#endif
				break;
			}
			default: assert(0); return false;
			}
		}

		basisu::vector<uint8_vec> level_data_bytes(total_levels);
		basisu::vector<uint8_vec> compressed_level_data_bytes(total_levels);
		uint_vec slice_level_offsets(m_slice_descs.size());

		// This will append the texture data in the correct order (for each level: layer, then face).
		for (uint32_t slice_index = 0; slice_index < m_slice_descs.size(); slice_index++)
		{
			const basisu_backend_slice_desc& slice_desc = m_slice_descs[slice_index];

			slice_level_offsets[slice_index] = level_data_bytes[slice_desc.m_mip_index].size();

			if (m_params.m_uastc)
				append_vector(level_data_bytes[slice_desc.m_mip_index], m_uastc_backend_output.m_slice_image_data[slice_index]);
			else
				append_vector(level_data_bytes[slice_desc.m_mip_index], backend_output.m_slice_image_data[slice_index]);
		}

		// UASTC supercompression
		if ((m_params.m_uastc) && (header.m_supercompression_scheme == basist::KTX2_SS_ZSTANDARD))
		{
#if BASISD_SUPPORT_KTX2_ZSTD
			for (uint32_t level_index = 0; level_index < total_levels; level_index++)
			{
				compressed_level_data_bytes[level_index].resize(ZSTD_compressBound(level_data_bytes[level_index].size()));

				size_t result = ZSTD_compress(compressed_level_data_bytes[level_index].data(), compressed_level_data_bytes[level_index].size(),
					level_data_bytes[level_index].data(), level_data_bytes[level_index].size(),
					m_params.m_ktx2_zstd_supercompression_level);

				if (ZSTD_isError(result))
					return false;

				compressed_level_data_bytes[level_index].resize(result);
			}
#else
			// Can't get here
			assert(0);
			return false;
#endif
		}
		else
		{
			// No supercompression
			compressed_level_data_bytes = level_data_bytes;
		}
				
		uint8_vec etc1s_global_data;

		// Create ETC1S global supercompressed data
		if (!m_params.m_uastc)
		{
			basist::ktx2_etc1s_global_data_header etc1s_global_data_header;
			clear_obj(etc1s_global_data_header);

			etc1s_global_data_header.m_endpoint_count = backend_output.m_num_endpoints;
			etc1s_global_data_header.m_selector_count = backend_output.m_num_selectors;
			etc1s_global_data_header.m_endpoints_byte_length = backend_output.m_endpoint_palette.size();
			etc1s_global_data_header.m_selectors_byte_length = backend_output.m_selector_palette.size();
			etc1s_global_data_header.m_tables_byte_length = backend_output.m_slice_image_tables.size();

			basisu::vector<basist::ktx2_etc1s_image_desc> etc1s_image_descs(total_levels * total_layers * total_faces);
			memset((void*)etc1s_image_descs.data(), 0, etc1s_image_descs.size_in_bytes());

			for (uint32_t slice_index = 0; slice_index < m_slice_descs.size(); slice_index++)
			{
				const basisu_backend_slice_desc& slice_desc = m_slice_descs[slice_index];

				const uint32_t level_index = slice_desc.m_mip_index;
				uint32_t layer_index = slice_desc.m_source_file_index;
				uint32_t face_index = 0;

				if (m_params.m_tex_type == basist::cBASISTexTypeCubemapArray)
				{
					face_index = layer_index % 6;
					layer_index /= 6;
				}

				const uint32_t etc1s_image_index = level_index * (total_layers * total_faces) + layer_index * total_faces + face_index;

				if (slice_desc.m_alpha)
				{
					etc1s_image_descs[etc1s_image_index].m_alpha_slice_byte_length = backend_output.m_slice_image_data[slice_index].size();
					etc1s_image_descs[etc1s_image_index].m_alpha_slice_byte_offset = slice_level_offsets[slice_index];
				}
				else
				{
					if (m_params.m_tex_type == basist::cBASISTexTypeVideoFrames)
						etc1s_image_descs[etc1s_image_index].m_image_flags = !slice_desc.m_iframe ? basist::KTX2_IMAGE_IS_P_FRAME : 0;

					etc1s_image_descs[etc1s_image_index].m_rgb_slice_byte_length = backend_output.m_slice_image_data[slice_index].size();
					etc1s_image_descs[etc1s_image_index].m_rgb_slice_byte_offset = slice_level_offsets[slice_index];
				}
			} // slice_index

			append_vector(etc1s_global_data, (const uint8_t*)&etc1s_global_data_header, sizeof(etc1s_global_data_header));
			append_vector(etc1s_global_data, (const uint8_t*)etc1s_image_descs.data(), etc1s_image_descs.size_in_bytes());
			append_vector(etc1s_global_data, backend_output.m_endpoint_palette);
			append_vector(etc1s_global_data, backend_output.m_selector_palette);
			append_vector(etc1s_global_data, backend_output.m_slice_image_tables);
			
			header.m_supercompression_scheme = basist::KTX2_SS_BASISLZ;
		}

		// Key values
		basist::ktx2_transcoder::key_value_vec key_values(m_params.m_ktx2_key_values);
		key_values.enlarge(1);
		
		const char* pKTXwriter = "KTXwriter";
		key_values.back().m_key.resize(strlen(pKTXwriter) + 1);
		memcpy(key_values.back().m_key.data(), pKTXwriter, strlen(pKTXwriter) + 1);

		char writer_id[128];
#ifdef _MSC_VER
		sprintf_s(writer_id, sizeof(writer_id), "Basis Universal %s", BASISU_LIB_VERSION_STRING);
#else
		snprintf(writer_id, sizeof(writer_id), "Basis Universal %s", BASISU_LIB_VERSION_STRING);
#endif
		key_values.back().m_value.resize(strlen(writer_id) + 1);
		memcpy(key_values.back().m_value.data(), writer_id, strlen(writer_id) + 1);

		key_values.sort();

#if BASISU_DISABLE_KTX2_KEY_VALUES
		// HACK HACK - Clear the key values array, which causes no key values to be written (triggering the ktx2check validator bug).
		key_values.clear();
#endif

		uint8_vec key_value_data;

		// DFD
		uint8_vec dfd;
		get_dfd(dfd, header);

		const uint32_t kvd_file_offset = sizeof(header) + sizeof(basist::ktx2_level_index) * total_levels + dfd.size();

		for (uint32_t pass = 0; pass < 2; pass++)
		{
			for (uint32_t i = 0; i < key_values.size(); i++)
			{
				if (key_values[i].m_key.size() < 2)
					return false;

				if (key_values[i].m_key.back() != 0)
					return false;

				const uint64_t total_len = (uint64_t)key_values[i].m_key.size() + (uint64_t)key_values[i].m_value.size();
				if (total_len >= UINT32_MAX)
					return false;

				packed_uint<4> le_len((uint32_t)total_len);
				append_vector(key_value_data, (const uint8_t*)&le_len, sizeof(le_len));

				append_vector(key_value_data, key_values[i].m_key);
				append_vector(key_value_data, key_values[i].m_value);

				const uint32_t ofs = key_value_data.size() & 3;
				const uint32_t padding = (4 - ofs) & 3;
				for (uint32_t p = 0; p < padding; p++)
					key_value_data.push_back(0);
			}

			if (header.m_supercompression_scheme != basist::KTX2_SS_NONE)
				break;

#if BASISU_DISABLE_KTX2_ALIGNMENT_WORKAROUND
			break;
#endif
			
			// Hack to ensure the KVD block ends on a 16 byte boundary, because we have no other official way of aligning the data.
			uint32_t kvd_end_file_offset = kvd_file_offset + key_value_data.size();
			uint32_t bytes_needed_to_pad = (16 - (kvd_end_file_offset & 15)) & 15;
			if (!bytes_needed_to_pad)
			{
				// We're good. No need to add a dummy key.
				break;
			}

			assert(!pass);
			if (pass)
				return false;

			if (bytes_needed_to_pad < 6)
				bytes_needed_to_pad += 16;

			printf("WARNING: Due to a KTX2 validator bug related to mipPadding, we must insert a dummy key into the KTX2 file of %u bytes\n", bytes_needed_to_pad);
			
			// We're not good - need to add a dummy key large enough to force file alignment so the mip level array gets aligned. 
			// We can't just add some bytes before the mip level array because ktx2check will see that as extra data in the file that shouldn't be there in ktxValidator::validateDataSize().
			key_values.enlarge(1);
			for (uint32_t i = 0; i < (bytes_needed_to_pad - 4 - 1 - 1); i++)
				key_values.back().m_key.push_back(127);
			
			key_values.back().m_key.push_back(0);

			key_values.back().m_value.push_back(0);

			key_values.sort();

			key_value_data.resize(0);
			
			// Try again
		}

		basisu::vector<basist::ktx2_level_index> level_index_array(total_levels);
		memset((void*)level_index_array.data(), 0, level_index_array.size_in_bytes());
				
		m_output_ktx2_file.clear();
		m_output_ktx2_file.reserve(m_output_basis_file.size());

		// Dummy header
		m_output_ktx2_file.resize(sizeof(header));

		// Level index array
		append_vector(m_output_ktx2_file, (const uint8_t*)level_index_array.data(), level_index_array.size_in_bytes());
				
		// DFD
		const uint8_t* pDFD = dfd.data();
		uint32_t dfd_len = dfd.size();

		header.m_dfd_byte_offset = m_output_ktx2_file.size();
		header.m_dfd_byte_length = dfd_len;
		append_vector(m_output_ktx2_file, pDFD, dfd_len);

		// Key value data
		if (key_value_data.size())
		{
			assert(kvd_file_offset == m_output_ktx2_file.size());

			header.m_kvd_byte_offset = m_output_ktx2_file.size();
			header.m_kvd_byte_length = key_value_data.size();
			append_vector(m_output_ktx2_file, key_value_data);
		}

		// Global Supercompressed Data
		if (etc1s_global_data.size())
		{
			uint32_t ofs = m_output_ktx2_file.size() & 7;
			uint32_t padding = (8 - ofs) & 7;
			for (uint32_t i = 0; i < padding; i++)
				m_output_ktx2_file.push_back(0);

			header.m_sgd_byte_length = etc1s_global_data.size();
			header.m_sgd_byte_offset = m_output_ktx2_file.size();

			append_vector(m_output_ktx2_file, etc1s_global_data);
		}

		// mipPadding
		if (header.m_supercompression_scheme == basist::KTX2_SS_NONE)
		{
			// We currently can't do this or the validator will incorrectly give an error.
			uint32_t ofs = m_output_ktx2_file.size() & 15;
			uint32_t padding = (16 - ofs) & 15;

			// Make sure we're always aligned here (due to a validator bug).
			if (padding)
			{
				printf("Warning: KTX2 mip level data is not 16-byte aligned. This may trigger a ktx2check validation bug. Writing %u bytes of mipPadding.\n", padding);
			}

			for (uint32_t i = 0; i < padding; i++)
				m_output_ktx2_file.push_back(0);
		}

		// Level data - write the smallest mipmap first.
		for (int level = total_levels - 1; level >= 0; level--)
		{
			level_index_array[level].m_byte_length = compressed_level_data_bytes[level].size();
			if (m_params.m_uastc)
				level_index_array[level].m_uncompressed_byte_length = level_data_bytes[level].size();

			level_index_array[level].m_byte_offset = m_output_ktx2_file.size();
			append_vector(m_output_ktx2_file, compressed_level_data_bytes[level]);
		}
		
		// Write final header
		memcpy(m_output_ktx2_file.data(), &header, sizeof(header));

		// Write final level index array
		memcpy(m_output_ktx2_file.data() + sizeof(header), level_index_array.data(), level_index_array.size_in_bytes());

		debug_printf("Total .ktx2 output file size: %u\n", m_output_ktx2_file.size());

		return true;
	}